

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O2

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat_conflict *st)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  mode_t mVar4;
  int iVar5;
  char *pcVar6;
  int64_t iVar7;
  char *pcVar8;
  int *piVar10;
  long lVar11;
  char *__path;
  void *__value;
  size_t size;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint *puVar15;
  archive_vtable_conflict *paVar16;
  long lVar17;
  size_t sVar18;
  int local_10e8;
  stat_conflict s;
  long local_1038 [2];
  undefined4 local_1028;
  uint local_1024;
  undefined4 local_1020;
  uint local_ff0 [1008];
  ssize_t sVar9;
  
  archive_clear_error(_a);
  pcVar6 = archive_entry_sourcepath(entry);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = archive_entry_pathname(entry);
  }
  if (_a[1].vtable == (archive_vtable_conflict *)0x0) {
    if (st == (stat_conflict *)0x0) {
      if (fd < 0) {
        if (*(char *)((long)&_a[1].magic + 1) == '\0') {
          st = &s;
          iVar2 = lstat(pcVar6,(stat *)st);
          if (iVar2 != 0) {
            piVar10 = __errno_location();
            iVar2 = *piVar10;
            pcVar8 = "Can\'t lstat %s";
            goto LAB_001e8edd;
          }
        }
        else {
          st = &s;
          iVar2 = stat(pcVar6,(stat *)st);
          if (iVar2 != 0) {
            piVar10 = __errno_location();
            iVar2 = *piVar10;
            pcVar8 = "Can\'t stat %s";
LAB_001e8edd:
            archive_set_error(_a,iVar2,pcVar8,pcVar6);
            return -0x19;
          }
        }
      }
      else {
        st = &s;
        iVar2 = fstat(fd,(stat *)st);
        if (iVar2 != 0) {
          piVar10 = __errno_location();
          iVar2 = *piVar10;
          pcVar6 = "Can\'t fstat";
          goto LAB_001e8c88;
        }
      }
    }
    archive_entry_copy_stat(entry,st);
  }
  iVar7 = archive_entry_uid(entry);
  pcVar8 = archive_read_disk_uname(_a,iVar7);
  if (pcVar8 != (char *)0x0) {
    archive_entry_copy_uname(entry,pcVar8);
  }
  iVar7 = archive_entry_gid(entry);
  pcVar8 = archive_read_disk_gname(_a,iVar7);
  if (pcVar8 != (char *)0x0) {
    archive_entry_copy_gname(entry,pcVar8);
  }
  if ((st->st_mode & 0xf000) == 0xa000) {
    sVar18 = st->st_size + 1;
    pcVar8 = (char *)malloc(sVar18);
    if (pcVar8 == (char *)0x0) {
      pcVar6 = "Couldn\'t read link data";
      iVar2 = 0xc;
LAB_001e8c88:
      archive_set_error(_a,iVar2,pcVar6);
      return -0x19;
    }
    if (_a[1].vtable == (archive_vtable_conflict *)0x0) {
      sVar9 = readlink(pcVar6,pcVar8,sVar18);
      uVar3 = (uint)sVar9;
    }
    else {
      iVar2 = (*(code *)_a[1].archive_format_name)();
      sVar9 = readlinkat(iVar2,pcVar6,pcVar8,sVar18);
      uVar3 = (uint)sVar9;
    }
    if ((int)uVar3 < 0) {
      piVar10 = __errno_location();
      archive_set_error(_a,*piVar10,"Couldn\'t read link data");
      free(pcVar8);
      return -0x19;
    }
    pcVar8[uVar3 & 0x7fffffff] = '\0';
    archive_entry_set_symlink(entry,pcVar8);
    free(pcVar8);
  }
  pcVar6 = archive_entry_sourcepath(entry);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = archive_entry_pathname(entry);
  }
  local_10e8 = fd;
  if (fd < 0) {
    paVar16 = _a[1].vtable;
    if (paVar16 == (archive_vtable_conflict *)0x0) {
LAB_001e8e8c:
      if (*(char *)((long)&_a[1].magic + 1) == '\0') {
        sVar18 = llistxattr(pcVar6,(char *)0x0,0);
      }
      else {
        sVar18 = listxattr(pcVar6,(char *)0x0,0);
      }
      goto LAB_001e8d03;
    }
    if (*(char *)((long)&_a[1].magic + 1) == '\0') {
      mVar4 = archive_entry_filetype(entry);
      if (mVar4 != 0xa000) {
        paVar16 = _a[1].vtable;
        goto LAB_001e8d76;
      }
    }
    else {
LAB_001e8d76:
      local_10e8 = (**(code **)&_a[1].archive_format)(paVar16,pcVar6,0x800);
      if (-1 < local_10e8) goto LAB_001e8cf7;
    }
    iVar2 = (**(code **)&_a[1].compression_code)(_a[1].vtable);
    if (iVar2 == 0) goto LAB_001e8e8c;
    piVar10 = __errno_location();
    archive_set_error(_a,*piVar10,"Couldn\'t access %s",pcVar6);
    iVar2 = -0x19;
  }
  else {
LAB_001e8cf7:
    sVar18 = flistxattr(local_10e8,(char *)0x0,0);
LAB_001e8d03:
    iVar2 = 0;
    if (sVar18 != 0) {
      if (sVar18 == 0xffffffffffffffff) {
        piVar10 = __errno_location();
        iVar5 = *piVar10;
        if ((iVar5 != 0x26) && (iVar5 != 0x5f)) {
          archive_set_error(_a,iVar5,"Couldn\'t list extended attributes");
          iVar2 = -0x14;
        }
      }
      else {
        pcVar8 = (char *)malloc(sVar18);
        if (pcVar8 == (char *)0x0) {
          piVar10 = __errno_location();
          archive_set_error(_a,*piVar10,"Out of memory");
          iVar2 = -0x1e;
        }
        else {
          if (local_10e8 < 0) {
            if (*(char *)((long)&_a[1].magic + 1) == '\0') {
              lVar11 = llistxattr(pcVar6,pcVar8,sVar18);
            }
            else {
              lVar11 = listxattr(pcVar6,pcVar8,sVar18);
            }
          }
          else {
            lVar11 = flistxattr(local_10e8,pcVar8,sVar18);
          }
          pcVar6 = pcVar8;
          if (lVar11 == -1) {
            piVar10 = __errno_location();
            archive_set_error(_a,*piVar10,"Couldn\'t retrieve extended attributes");
            free(pcVar8);
            iVar2 = -0x14;
          }
          else {
            for (; (long)pcVar6 - (long)pcVar8 < lVar11; pcVar6 = pcVar6 + sVar18 + 1) {
              iVar2 = strncmp(pcVar6,"system.",7);
              if ((iVar2 != 0) && (iVar2 = strncmp(pcVar6,"xfsroot.",8), iVar2 != 0)) {
                __path = archive_entry_sourcepath(entry);
                if (__path == (char *)0x0) {
                  __path = archive_entry_pathname(entry);
                }
                if (local_10e8 < 0) {
                  if (*(char *)((long)&_a[1].magic + 1) == '\0') {
                    sVar18 = lgetxattr(__path,pcVar6,(void *)0x0,0);
                  }
                  else {
                    sVar18 = getxattr(__path,pcVar6,(void *)0x0,0);
                  }
                }
                else {
                  sVar18 = fgetxattr(local_10e8,pcVar6,(void *)0x0,0);
                }
                if (sVar18 == 0xffffffffffffffff) {
                  piVar10 = __errno_location();
                  archive_set_error(_a,*piVar10,"Couldn\'t query extended attribute");
                }
                else {
                  if ((long)sVar18 < 1) {
                    __value = (void *)0x0;
                  }
                  else {
                    __value = malloc(sVar18);
                    if (__value == (void *)0x0) {
                      piVar10 = __errno_location();
                      archive_set_error(_a,*piVar10,"Out of memory");
                      goto LAB_001e90c2;
                    }
                  }
                  if (local_10e8 < 0) {
                    if (*(char *)((long)&_a[1].magic + 1) == '\0') {
                      size = lgetxattr(__path,pcVar6,__value,sVar18);
                    }
                    else {
                      size = getxattr(__path,pcVar6,__value,sVar18);
                    }
                  }
                  else {
                    size = fgetxattr(local_10e8,pcVar6,__value,sVar18);
                  }
                  if (size == 0xffffffffffffffff) {
                    piVar10 = __errno_location();
                    archive_set_error(_a,*piVar10,"Couldn\'t read extended attribute");
                  }
                  else {
                    archive_entry_xattr_add_entry(entry,pcVar6,__value,size);
                    free(__value);
                  }
                }
              }
LAB_001e90c2:
              sVar18 = strlen(pcVar6);
            }
            free(pcVar8);
            iVar2 = 0;
          }
        }
      }
    }
  }
  mVar4 = archive_entry_filetype(entry);
  if (((mVar4 == 0x8000) && (iVar7 = archive_entry_size(entry), 0 < iVar7)) &&
     (pcVar6 = archive_entry_hardlink(entry), pcVar6 == (char *)0x0)) {
    if (local_10e8 < 0) {
      pcVar6 = archive_entry_sourcepath(entry);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = archive_entry_pathname(entry);
      }
      if (_a[1].vtable == (archive_vtable_conflict *)0x0) {
        local_10e8 = open(pcVar6,0x80800);
      }
      else {
        local_10e8 = (**(code **)&_a[1].archive_format)(_a[1].vtable,pcVar6,0x80800);
      }
      if (local_10e8 < 0) {
        iVar5 = -0x19;
        piVar10 = __errno_location();
        archive_set_error(_a,*piVar10,"Can\'t open `%s\'",pcVar6);
        goto LAB_001e92ae;
      }
      __archive_ensure_cloexec_flag(local_10e8);
    }
    memset(local_1038,0,0x1000);
    local_1038[1] = 0xffffffffffffffff;
    local_1028 = 1;
    local_1020 = 0x48;
    uVar12 = archive_entry_size(entry);
    while ((iVar5 = ioctl(local_10e8,0xc020660b,local_1038), -1 < iVar5 && (local_1024 != 0))) {
      puVar15 = local_ff0;
      bVar1 = true;
      uVar3 = local_1024;
      for (iVar5 = 0; iVar5 < (int)uVar3; iVar5 = iVar5 + 1) {
        uVar13 = *puVar15;
        if ((uVar13 >> 0xb & 1) == 0) {
          lVar11 = *(long *)(puVar15 + -10);
          uVar14 = lVar11 + *(long *)(puVar15 + -6);
          lVar17 = 0;
          if (uVar12 <= uVar14) {
            lVar17 = uVar14 - uVar12;
          }
          uVar14 = *(long *)(puVar15 + -6) - lVar17;
          if (uVar14 == uVar12 && lVar11 == 0) goto LAB_001e92ab;
          if (0 < (long)uVar14) {
            archive_entry_sparse_add_entry(entry,lVar11,uVar14);
            uVar13 = *puVar15;
            uVar3 = local_1024;
          }
        }
        if ((uVar13 & 1) != 0) {
          bVar1 = false;
        }
        puVar15 = puVar15 + 0xe;
      }
      if (!bVar1) break;
      local_1038[0] =
           s.__glibc_reserved[(ulong)uVar3 * 7 + 2] + s.__glibc_reserved[(ulong)uVar3 * 7];
    }
  }
LAB_001e92ab:
  iVar5 = 0;
LAB_001e92ae:
  if (iVar5 < iVar2) {
    iVar2 = iVar5;
  }
  if (local_10e8 != fd) {
    close(local_10e8);
  }
  return iVar2;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if (st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS)
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd, EXT2_IOC_GETFLAGS, &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size + 1;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = 0;
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = setup_acls(a, entry, &fd);
	r1 = setup_xattrs(a, entry, &fd);
	if (r1 < r)
		r = r1;
	if (a->enable_copyfile) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	r1 = setup_sparse(a, entry, &fd);
	if (r1 < r)
		r = r1;

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}